

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aeron.cpp
# Opt level: O1

ptr_t __thiscall aeron::Aeron::mapCncFile(Aeron *this,Context *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MemoryMappedFile *pMVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  long lVar6;
  int64_t iVar7;
  int *piVar8;
  uint8_t *puVar9;
  long lVar10;
  SourcedException *pSVar11;
  char *pcVar12;
  Context *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  long lVar14;
  ptr_t pVar15;
  ManyToOneRingBuffer ringBuffer;
  AtomicBuffer toDriverBuffer;
  allocator local_e9;
  Context *local_e8;
  Aeron *local_e0;
  string local_d8;
  undefined1 local_b8 [32];
  int local_98;
  string local_90;
  string local_70;
  AtomicBuffer local_50;
  _func_int **local_38;
  
  local_e8 = in_RDX;
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar6 = lVar6 / 1000000;
  this->_vptr_Aeron = (_func_int **)0x0;
  (this->m_randomDevice).field_0.field_0._M_file = (void *)0x0;
  local_38 = (_func_int **)&PTR__AtomicBuffer_00188668;
  local_e0 = this;
LAB_0015b413:
  do {
    Context::cncFileName_abi_cxx11_((string *)local_b8,local_e8);
    iVar7 = util::MemoryMappedFile::getFileSize((char *)local_b8._0_8_);
    if ((AtomicBuffer *)local_b8._0_8_ != (AtomicBuffer *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if (iVar7 < 1) {
      lVar10 = std::chrono::_V2::system_clock::now();
      if (local_e8->m_mediaDriverTimeout + lVar6 < lVar10 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_d8,local_e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"CnC file not created: ",&local_d8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar12 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                   );
        std::__cxx11::string::string((string *)&local_70,pcVar12,(allocator *)&local_50);
        util::SourcedException::SourcedException
                  (pSVar11,(string *)local_b8,&local_90,&local_70,0x69);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001886f0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_b8._0_8_ = (AtomicBuffer *)0x0;
      local_b8._8_8_ = 16000000;
      do {
        iVar5 = nanosleep((timespec *)local_b8,(timespec *)local_b8);
        if (iVar5 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      goto LAB_0015b413;
    }
    Context::cncFileName_abi_cxx11_((string *)local_b8,local_e8);
    util::MemoryMappedFile::mapExisting((MemoryMappedFile *)&local_d8,(char *)local_b8._0_8_);
    sVar4 = local_d8._M_string_length;
    _Var3._M_p = local_d8._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e0->m_randomDevice).field_0.field_0._M_file;
    local_e0->_vptr_Aeron = (_func_int **)_Var3._M_p;
    (local_e0->m_randomDevice).field_0.field_0._M_file = (void *)sVar4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
    }
    if ((AtomicBuffer *)local_b8._0_8_ != (AtomicBuffer *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
LAB_0015b506:
    pMVar2 = (MemoryMappedFile *)local_e0->_vptr_Aeron;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e0->m_randomDevice).field_0.field_0._M_file;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    piVar8 = (int *)util::MemoryMappedFile::getMemoryPtr(pMVar2);
    util::MemoryMappedFile::getMemorySize(pMVar2);
    iVar5 = *piVar8;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (iVar5 == 0) {
      lVar10 = std::chrono::_V2::system_clock::now();
      if (local_e8->m_mediaDriverTimeout + lVar6 < lVar10 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_d8,local_e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"CnC file is created but not initialised: ",&local_d8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar12 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                   );
        std::__cxx11::string::string((string *)&local_70,pcVar12,(allocator *)&local_50);
        util::SourcedException::SourcedException
                  (pSVar11,(string *)local_b8,&local_90,&local_70,0x78);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001886f0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_b8._0_8_ = (AtomicBuffer *)0x0;
      local_b8._8_8_ = 1000000;
      do {
        iVar5 = nanosleep((timespec *)local_b8,(timespec *)local_b8);
        if (iVar5 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      goto LAB_0015b506;
    }
    if (iVar5 != 0xf) {
      pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_d8,iVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "CnC file version not supported: ",&local_d8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 "");
      pcVar12 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                 );
      std::__cxx11::string::string((string *)&local_70,pcVar12,(allocator *)&local_50);
      util::SourcedException::SourcedException(pSVar11,(string *)local_b8,&local_90,&local_70,0x81);
      *(undefined ***)pSVar11 = &PTR__SourcedException_001886b0;
      __cxa_throw(pSVar11,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pMVar2 = (MemoryMappedFile *)local_e0->_vptr_Aeron;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e0->m_randomDevice).field_0.field_0._M_file;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    puVar9 = util::MemoryMappedFile::getMemoryPtr(pMVar2);
    util::MemoryMappedFile::getMemorySize(pMVar2);
    local_50.m_buffer = util::MemoryMappedFile::getMemoryPtr(pMVar2);
    local_50.m_buffer = local_50.m_buffer + CncFileDescriptor::META_DATA_LENGTH;
    local_50.m_length = *(length_t *)(puVar9 + 4);
    local_50._vptr_AtomicBuffer = local_38;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
              ((ManyToOneRingBuffer *)local_b8,&local_50);
    lVar10 = *(long *)(*(uint8_t **)(local_b8._0_8_ + 8) + local_98);
    while (lVar10 == 0) {
      lVar10 = std::chrono::_V2::system_clock::now();
      if (local_e8->m_mediaDriverTimeout + lVar6 < lVar10 / 1000000) {
        pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"no driver heartbeat detected","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,"");
        pcVar12 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                   );
        std::__cxx11::string::string((string *)&local_70,pcVar12,&local_e9);
        util::SourcedException::SourcedException(pSVar11,&local_d8,&local_90,&local_70,0x8b);
        *(undefined ***)pSVar11 = &PTR__SourcedException_001886f0;
        __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 1000000;
      do {
        iVar5 = nanosleep((timespec *)&local_d8,(timespec *)&local_d8);
        if (iVar5 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      lVar10 = *(long *)(*(uint8_t **)(local_b8._0_8_ + 8) + local_98);
    }
    lVar10 = std::chrono::_V2::system_clock::now();
    _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar10 / 1000000);
    lVar10 = *(long *)(*(uint8_t **)(local_b8._0_8_ + 8) + local_98);
    lVar14 = (long)_Var13._M_pi - local_e8->m_mediaDriverTimeout;
    if (lVar14 <= lVar10) goto LAB_0015b791;
    if (local_e8->m_mediaDriverTimeout + lVar6 < (long)_Var13._M_pi) {
      pSVar11 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"no driver heartbeat detected","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 "");
      pcVar12 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                 );
      std::__cxx11::string::string((string *)&local_70,pcVar12,&local_e9);
      util::SourcedException::SourcedException(pSVar11,&local_d8,&local_90,&local_70,0x96);
      *(undefined ***)pSVar11 = &PTR__SourcedException_001886f0;
      __cxa_throw(pSVar11,&util::DriverTimeoutException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_e0->m_randomDevice).field_0.field_0._M_file;
    local_e0->_vptr_Aeron = (_func_int **)0x0;
    (local_e0->m_randomDevice).field_0.field_0._M_file = (void *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 100000000;
    do {
      iVar5 = nanosleep((timespec *)&local_d8,(timespec *)&local_d8);
      _Var13._M_pi = extraout_RDX;
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
      _Var13._M_pi = extraout_RDX_00;
    } while (*piVar8 == 4);
    if (lVar14 <= lVar10) {
LAB_0015b791:
      pVar15.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var13._M_pi;
      pVar15.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e0;
      return (ptr_t)pVar15.
                    super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

inline MemoryMappedFile::ptr_t Aeron::mapCncFile(Context &context)
{
    const long long startMs = currentTimeMillis();
    MemoryMappedFile::ptr_t cncBuffer;

    while (true)
    {
        while (MemoryMappedFile::getFileSize(context.cncFileName().c_str()) <= 0)
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException("CnC file not created: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_16);
        }

        cncBuffer = MemoryMappedFile::mapExisting(context.cncFileName().c_str());

        std::int32_t cncVersion = 0;

        while (0 == (cncVersion = CncFileDescriptor::cncVersionVolatile(cncBuffer)))
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(
                    "CnC file is created but not initialised: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        if (CncFileDescriptor::CNC_VERSION != cncVersion)
        {
            throw util::IllegalStateException(
                "CnC file version not supported: " + std::to_string(cncVersion), SOURCEINFO);
        }

        AtomicBuffer toDriverBuffer(CncFileDescriptor::createToDriverBuffer(cncBuffer));
        ManyToOneRingBuffer ringBuffer(toDriverBuffer);

        while (0 == ringBuffer.consumerHeartbeatTime())
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        const long long timeMs = currentTimeMillis();
        if (ringBuffer.consumerHeartbeatTime() < (timeMs - context.m_mediaDriverTimeout))
        {
            if (timeMs > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            cncBuffer = nullptr;

            std::this_thread::sleep_for(IDLE_SLEEP_MS_100);
            continue;
        }

        break;
    }

    return cncBuffer;
}